

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_> *this,void **vtt,
          TPZGeoMesh *DestMesh,TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  atomic_int *paVar1;
  void *pvVar2;
  TPZReference *pTVar3;
  long *plVar4;
  iterator iVar5;
  ostream *poVar6;
  mapped_type_conflict *pmVar7;
  mapped_type_conflict mVar8;
  long lVar9;
  stringstream sout;
  ostream local_1a8 [376];
  
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_>,vtt + 1,
             DestMesh,&cp->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_>,
             gl2lcNdMap,gl2lcElMap);
  pvVar2 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_>).
             super_TPZGeoEl = pvVar2;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_>).fGeo.
                   super_TPZGeoPyramid.super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
            *(long *)((long)pvVar2 + -0x60) + -0x48) = vtt[5];
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fNAlloc = 0;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  pTVar3 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  _sout = 0;
  TPZVec<long>::Resize(&this->fSubEl,(cp->fSubEl).fNElements,(long *)&sout);
  lVar9 = 0;
  do {
    if ((cp->fSubEl).fNElements <= lVar9) {
      return;
    }
    plVar4 = (cp->fSubEl).fStore;
    mVar8 = -1;
    if (plVar4[lVar9] != -1) {
      iVar5 = std::
              _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
              ::find(&gl2lcElMap->_M_t,plVar4 + lVar9);
      if ((_Rb_tree_header *)iVar5._M_node == &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::stringstream::stringstream((stringstream *)&sout);
        poVar6 = std::operator<<(local_1a8,"ERROR in - ");
        poVar6 = std::operator<<(poVar6,
                                 "TPZGeoElRefPattern<pzgeom::TPZGeoBlend<TPZGeoPyramid>>::TPZGeoElRefPattern(TPZGeoMesh &, const TPZGeoElRefPattern<TGeo> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TGeo = pzgeom::TPZGeoBlend<TPZGeoPyramid>]"
                                );
        poVar6 = std::operator<<(poVar6," subelement ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar9);
        poVar6 = std::operator<<(poVar6," index = ");
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::operator<<(poVar6," is not in the map.");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/tpzgeoelrefpattern.h.h"
                   ,0x7a);
      }
      pmVar7 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](gl2lcElMap,(cp->fSubEl).fStore + lVar9);
      mVar8 = *pmVar7;
    }
    (this->fSubEl).fStore[lVar9] = mVar8;
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh,
											 const TPZGeoElRefPattern<TGeo> &cp,
											 std::map<int64_t,int64_t> &gl2lcNdMap,
											 std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp,gl2lcNdMap,gl2lcElMap),
fRefPattern ( cp.fRefPattern )
{
	int i;
    this->fSubEl.Resize(cp.fSubEl.size(),0);
	for (i=0;i<cp.fSubEl.NElements();i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i] = -1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
			std::stringstream sout;
			sout << "ERROR in - " << __PRETTY_FUNCTION__
			<< " subelement " << i << " index = " << cp.fSubEl[i] << " is not in the map.";
#ifdef PZ_LOG
            TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
			LOGPZ_ERROR (loggerrefpattern,sout.str().c_str());
#endif
			DebugStop();
		}
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}